

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void * google::protobuf::internal::CreateSplitMessageGeneric
                 (Arena *arena,void *default_split,size_t size,void *message,void *default_message)

{
  void **v1;
  void **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  void *local_88;
  void *split;
  LogMessage local_50;
  Voidify local_39;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  void *default_message_local;
  void *message_local;
  size_t size_local;
  void *default_split_local;
  Arena *arena_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)default_message;
  default_message_local = message;
  message_local = (void *)size;
  size_local = (size_t)default_split;
  default_split_local = arena;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<void_const*>(&default_message_local);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<void_const*>
                 (&absl_log_internal_check_op_result);
  local_38 = absl::lts_20250127::log_internal::Check_NEImpl<void_const*,void_const*>
                       (v1,v2,"message != default_message");
  if (local_38 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_38);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
               ,0xf2,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  if (default_split_local == (void *)0x0) {
    local_88 = operator_new((ulong)message_local);
  }
  else {
    local_88 = Arena::AllocateAligned((Arena *)default_split_local,(size_t)message_local,8);
  }
  memcpy(local_88,(void *)size_local,(size_t)message_local);
  return local_88;
}

Assistant:

void* CreateSplitMessageGeneric(Arena* arena, const void* default_split,
                                size_t size, const void* message,
                                const void* default_message) {
  ABSL_DCHECK_NE(message, default_message);
  void* split =
      (arena == nullptr) ? ::operator new(size) : arena->AllocateAligned(size);
  memcpy(split, default_split, size);
  return split;
}